

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O2

cio_error cio_uart_set_baud_rate(cio_uart *port,cio_uart_baud_rate baud_rate)

{
  cio_error cVar1;
  int iVar2;
  int *piVar3;
  termios tty;
  
  if (port != (cio_uart *)0x0) {
    cVar1 = get_current_settings(port,&tty);
    if (cVar1 == CIO_SUCCESS) {
      if (baud_rate < (CIO_UART_BAUD_RATE_3500000|CIO_UART_BAUD_RATE_110)) {
        iVar2 = cfsetspeed((termios *)&tty,*(speed_t *)(&DAT_00103368 + (ulong)baud_rate * 4));
        if (iVar2 == -1) {
          piVar3 = __errno_location();
          cVar1 = -*piVar3;
        }
        else {
          cVar1 = set_termios((port->impl).ev.fd,&tty);
        }
      }
      else {
        cVar1 = CIO_INVALID_ARGUMENT;
      }
    }
    return cVar1;
  }
  return CIO_INVALID_ARGUMENT;
}

Assistant:

enum cio_error cio_uart_set_baud_rate(const struct cio_uart *port, enum cio_uart_baud_rate baud_rate)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	int ret = 0;
	switch (baud_rate) {
	case CIO_UART_BAUD_RATE_50:
		ret = cfsetspeed(&tty, (speed_t)B50);
		break;
	case CIO_UART_BAUD_RATE_75:
		ret = cfsetspeed(&tty, (speed_t)B75);
		break;
	case CIO_UART_BAUD_RATE_110:
		ret = cfsetspeed(&tty, (speed_t)B110);
		break;
	case CIO_UART_BAUD_RATE_134:
		ret = cfsetspeed(&tty, (speed_t)B134);
		break;
	case CIO_UART_BAUD_RATE_150:
		ret = cfsetspeed(&tty, (speed_t)B150);
		break;
	case CIO_UART_BAUD_RATE_200:
		ret = cfsetspeed(&tty, (speed_t)B200);
		break;
	case CIO_UART_BAUD_RATE_300:
		ret = cfsetspeed(&tty, (speed_t)B300);
		break;
	case CIO_UART_BAUD_RATE_600:
		ret = cfsetspeed(&tty, (speed_t)B600);
		break;
	case CIO_UART_BAUD_RATE_1200:
		ret = cfsetspeed(&tty, (speed_t)B1200);
		break;
	case CIO_UART_BAUD_RATE_1800:
		ret = cfsetspeed(&tty, (speed_t)B1800);
		break;
	case CIO_UART_BAUD_RATE_2400:
		ret = cfsetspeed(&tty, (speed_t)B2400);
		break;
	case CIO_UART_BAUD_RATE_4800:
		ret = cfsetspeed(&tty, (speed_t)B4800);
		break;
	case CIO_UART_BAUD_RATE_9600:
		ret = cfsetspeed(&tty, (speed_t)B9600);
		break;
	case CIO_UART_BAUD_RATE_19200:
		ret = cfsetspeed(&tty, (speed_t)B19200);
		break;
	case CIO_UART_BAUD_RATE_38400:
		ret = cfsetspeed(&tty, (speed_t)B38400);
		break;
	case CIO_UART_BAUD_RATE_57600:
		ret = cfsetspeed(&tty, (speed_t)B57600);
		break;
	case CIO_UART_BAUD_RATE_115200:
		ret = cfsetspeed(&tty, (speed_t)B115200);
		break;
	case CIO_UART_BAUD_RATE_230400:
		ret = cfsetspeed(&tty, (speed_t)B230400);
		break;
	case CIO_UART_BAUD_RATE_460800:
		ret = cfsetspeed(&tty, (speed_t)B460800);
		break;
	case CIO_UART_BAUD_RATE_500000:
		ret = cfsetspeed(&tty, (speed_t)B500000);
		break;
	case CIO_UART_BAUD_RATE_576000:
		ret = cfsetspeed(&tty, (speed_t)B576000);
		break;
	case CIO_UART_BAUD_RATE_921600:
		ret = cfsetspeed(&tty, (speed_t)B921600);
		break;
	case CIO_UART_BAUD_RATE_1000000:
		ret = cfsetspeed(&tty, (speed_t)B1000000);
		break;
	case CIO_UART_BAUD_RATE_1152000:
		ret = cfsetspeed(&tty, (speed_t)B1152000);
		break;
	case CIO_UART_BAUD_RATE_1500000:
		ret = cfsetspeed(&tty, (speed_t)B1500000);
		break;
	case CIO_UART_BAUD_RATE_2000000:
		ret = cfsetspeed(&tty, (speed_t)B2000000);
		break;
	case CIO_UART_BAUD_RATE_2500000:
		ret = cfsetspeed(&tty, (speed_t)B2500000);
		break;
	case CIO_UART_BAUD_RATE_3000000:
		ret = cfsetspeed(&tty, (speed_t)B3000000);
		break;
	case CIO_UART_BAUD_RATE_3500000:
		ret = cfsetspeed(&tty, (speed_t)B3500000);
		break;
	case CIO_UART_BAUD_RATE_4000000:
		ret = cfsetspeed(&tty, (speed_t)B4000000);
		break;
	default:
		return CIO_INVALID_ARGUMENT;
	}

	if (cio_unlikely(ret == -1)) {
		return (enum cio_error)(-errno);
	}

	err = set_termios(port->impl.ev.fd, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	return CIO_SUCCESS;
}